

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O2

Maybe<kj::Own<const_kj::File,_std::nullptr_t>_> __thiscall
kj::anon_unknown_59::InMemoryDirectory::tryOpenFile
          (InMemoryDirectory *this,PathPtr path,WriteMode mode)

{
  _func_int **pp_Var1;
  Disposer DVar2;
  undefined4 in_register_0000000c;
  long lVar3;
  File *pFVar4;
  File *extraout_RDX;
  _func_int **pp_Var5;
  File *extraout_RDX_00;
  File *extraout_RDX_01;
  uint in_R8D;
  Maybe<kj::Own<const_kj::File,_std::nullptr_t>_> MVar6;
  StringPtr name;
  StringPtr name_00;
  Fault f;
  undefined1 local_50 [16];
  FsNode local_40;
  Disposer local_38;
  
  lVar3 = CONCAT44(in_register_0000000c,mode);
  pFVar4 = (File *)path.parts.size_;
  name_00.content.ptr = (Locked<kj::(anonymous_namespace)::InMemoryDirectory::Impl> *)path.parts.ptr
  ;
  if (lVar3 == 1) {
    MutexGuarded<kj::(anonymous_namespace)::InMemoryDirectory::Impl>::lockExclusive
              ((MutexGuarded<kj::(anonymous_namespace)::InMemoryDirectory::Impl> *)local_50,
               &name_00.content.ptr[1].ptr);
    pp_Var1 = pFVar4[1].super_ReadableFile.super_FsNode._vptr_FsNode;
    if (pp_Var1 == (_func_int **)0x0) {
      pp_Var5 = (_func_int **)0x4706a1;
    }
    else {
      pp_Var5 = (pFVar4->super_ReadableFile).super_FsNode._vptr_FsNode;
    }
    name.content.size_ = (size_t)pp_Var5;
    name.content.ptr = (char *)local_50._8_8_;
    Impl::openEntry((Impl *)&stack0xffffffffffffffc0,name,
                    (int)pp_Var1 + (uint)(pp_Var1 == (_func_int **)0x0));
    if ((Exception *)local_40._vptr_FsNode == (Exception *)0x0) {
      (this->super_Directory).super_ReadableDirectory.super_FsNode._vptr_FsNode = (_func_int **)0x0;
      (this->super_AtomicRefcounted).super_Disposer._vptr_Disposer = (_func_int **)0x0;
    }
    else {
      asFile(this,name_00.content.ptr,(EntryImpl *)local_50,(WriteMode)local_40._vptr_FsNode);
    }
    Locked<kj::(anonymous_namespace)::InMemoryDirectory::Impl>::~Locked
              ((Locked<kj::(anonymous_namespace)::InMemoryDirectory::Impl> *)local_50);
    pFVar4 = extraout_RDX_01;
  }
  else if (lVar3 == 0) {
    if ((in_R8D & 2) == 0) {
      if ((in_R8D & 1) != 0) {
        (this->super_Directory).super_ReadableDirectory.super_FsNode._vptr_FsNode =
             (_func_int **)0x0;
        (this->super_AtomicRefcounted).super_Disposer._vptr_Disposer = (_func_int **)0x0;
        goto LAB_00413903;
      }
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[19]>
                ((Fault *)local_50,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem.c++"
                 ,0x477,FAILED,(char *)0x0,"\"can\'t replace self\"",
                 (char (*) [19])"can\'t replace self");
    }
    else {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[11]>
                ((Fault *)local_50,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem.c++"
                 ,0x473,FAILED,(char *)0x0,"\"not a file\"",(char (*) [11])"not a file");
    }
    (this->super_Directory).super_ReadableDirectory.super_FsNode._vptr_FsNode = (_func_int **)0x0;
    (this->super_AtomicRefcounted).super_Disposer._vptr_Disposer = (_func_int **)0x0;
    kj::_::Debug::Fault::~Fault((Fault *)local_50);
    pFVar4 = extraout_RDX;
  }
  else {
    pp_Var1 = pFVar4[1].super_ReadableFile.super_FsNode._vptr_FsNode;
    if (pp_Var1 == (_func_int **)0x0) {
      pp_Var5 = (_func_int **)0x4706a1;
    }
    else {
      pp_Var5 = (pFVar4->super_ReadableFile).super_FsNode._vptr_FsNode;
    }
    name_00.content.size_ = (size_t)pp_Var5;
    tryGetParent((InMemoryDirectory *)&stack0xffffffffffffffc0,name_00,
                 (int)pp_Var1 + (uint)(pp_Var1 == (_func_int **)0x0));
    DVar2._vptr_Disposer = local_38._vptr_Disposer;
    local_50._0_8_ = local_40._vptr_FsNode;
    local_50._8_8_ = local_38._vptr_Disposer;
    local_38._vptr_Disposer = (_func_int **)0x0;
    Own<const_kj::Directory,_std::nullptr_t>::dispose
              ((Own<const_kj::Directory,_std::nullptr_t> *)&stack0xffffffffffffffc0);
    if ((Waiter *)DVar2._vptr_Disposer == (Waiter *)0x0) {
      (this->super_Directory).super_ReadableDirectory.super_FsNode._vptr_FsNode = (_func_int **)0x0;
      (this->super_AtomicRefcounted).super_Disposer._vptr_Disposer = (_func_int **)0x0;
    }
    else {
      (**(code **)(*DVar2._vptr_Disposer + 0x68))
                (this,DVar2._vptr_Disposer,pFVar4 + 3,lVar3 + -1,in_R8D);
    }
    Own<const_kj::Directory,_std::nullptr_t>::dispose
              ((Own<const_kj::Directory,_std::nullptr_t> *)local_50);
    pFVar4 = extraout_RDX_00;
  }
LAB_00413903:
  MVar6.ptr.ptr = pFVar4;
  MVar6.ptr.disposer = (Disposer *)this;
  return (Maybe<kj::Own<const_kj::File,_std::nullptr_t>_>)MVar6.ptr;
}

Assistant:

Maybe<Own<const File>> tryOpenFile(PathPtr path, WriteMode mode) const override {
    if (path.size() == 0) {
      if (has(mode, WriteMode::MODIFY)) {
        KJ_FAIL_REQUIRE("not a file") { return kj::none; }
      } else if (has(mode, WriteMode::CREATE)) {
        return kj::none;  // already exists (as a directory)
      } else {
        KJ_FAIL_REQUIRE("can't replace self") { return kj::none; }
      }
    } else if (path.size() == 1) {
      auto lock = impl.lockExclusive();
      KJ_IF_SOME(entry, lock->openEntry(path[0], mode)) {
        return asFile(lock, entry, mode);
      } else {
        return kj::none;
      }
    }